

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::variable_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRVariable *variable)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = this->is_using_builtin_array;
  iVar2 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1c])(this,variable,4);
  if ((char)iVar2 != '\0') {
    this->is_using_builtin_array = true;
  }
  CompilerGLSL::variable_decl_abi_cxx11_(__return_storage_ptr__,&this->super_CompilerGLSL,variable);
  this->is_using_builtin_array = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerMSL::variable_decl(const SPIRVariable &variable)
{
	bool old_is_using_builtin_array = is_using_builtin_array;

	// Threadgroup arrays can't have a wrapper type.
	if (variable_decl_is_remapped_storage(variable, StorageClassWorkgroup))
		is_using_builtin_array = true;

	auto expr = CompilerGLSL::variable_decl(variable);
	is_using_builtin_array = old_is_using_builtin_array;
	return expr;
}